

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

void process_line(BinarySource *in,strbuf *out)

{
  _Bool _Var1;
  uint uVar2;
  ptrlen pl;
  void *local_28;
  ptrlen id;
  strbuf *out_local;
  BinarySource *in_local;
  
  pl = get_word(in);
  _Var1 = ptrlen_eq_string(pl,"hello");
  if (_Var1) {
    handle_hello(in,out);
  }
  else {
    _Var1 = ptrlen_eq_string(pl,"free");
    if (_Var1) {
      handle_free(in,out);
    }
    else {
      _Var1 = ptrlen_eq_string(pl,"newstring");
      if (_Var1) {
        handle_newstring(in,out);
      }
      else {
        _Var1 = ptrlen_eq_string(pl,"getstring");
        if (_Var1) {
          handle_getstring(in,out);
        }
        else {
          _Var1 = ptrlen_eq_string(pl,"mp_literal");
          if (_Var1) {
            handle_mp_literal(in,out);
          }
          else {
            _Var1 = ptrlen_eq_string(pl,"mp_dump");
            if (_Var1) {
              handle_mp_dump(in,out);
            }
            else {
              _Var1 = ptrlen_eq_string(pl,"checkenum");
              if (_Var1) {
                handle_checkenum(in,out);
              }
              else {
                _Var1 = ptrlen_eq_string(pl,"mp_new");
                if (_Var1) {
                  handle_mp_new(in,out);
                }
                else {
                  _Var1 = ptrlen_eq_string(pl,"mp_clear");
                  if (_Var1) {
                    handle_mp_clear(in,out);
                  }
                  else {
                    _Var1 = ptrlen_eq_string(pl,"mp_from_bytes_le");
                    if (_Var1) {
                      handle_mp_from_bytes_le(in,out);
                    }
                    else {
                      _Var1 = ptrlen_eq_string(pl,"mp_from_bytes_be");
                      if (_Var1) {
                        handle_mp_from_bytes_be(in,out);
                      }
                      else {
                        _Var1 = ptrlen_eq_string(pl,"mp_from_integer");
                        if (_Var1) {
                          handle_mp_from_integer(in,out);
                        }
                        else {
                          _Var1 = ptrlen_eq_string(pl,"mp_from_decimal_pl");
                          if (_Var1) {
                            handle_mp_from_decimal_pl(in,out);
                          }
                          else {
                            _Var1 = ptrlen_eq_string(pl,"mp_from_decimal");
                            if (_Var1) {
                              handle_mp_from_decimal(in,out);
                            }
                            else {
                              _Var1 = ptrlen_eq_string(pl,"mp_from_hex_pl");
                              if (_Var1) {
                                handle_mp_from_hex_pl(in,out);
                              }
                              else {
                                _Var1 = ptrlen_eq_string(pl,"mp_from_hex");
                                if (_Var1) {
                                  handle_mp_from_hex(in,out);
                                }
                                else {
                                  _Var1 = ptrlen_eq_string(pl,"mp_copy");
                                  if (_Var1) {
                                    handle_mp_copy(in,out);
                                  }
                                  else {
                                    _Var1 = ptrlen_eq_string(pl,"mp_power_2");
                                    if (_Var1) {
                                      handle_mp_power_2(in,out);
                                    }
                                    else {
                                      _Var1 = ptrlen_eq_string(pl,"mp_get_byte");
                                      if (_Var1) {
                                        handle_mp_get_byte(in,out);
                                      }
                                      else {
                                        _Var1 = ptrlen_eq_string(pl,"mp_get_bit");
                                        if (_Var1) {
                                          handle_mp_get_bit(in,out);
                                        }
                                        else {
                                          _Var1 = ptrlen_eq_string(pl,"mp_set_bit");
                                          if (_Var1) {
                                            handle_mp_set_bit(in,out);
                                          }
                                          else {
                                            _Var1 = ptrlen_eq_string(pl,"mp_max_bytes");
                                            if (_Var1) {
                                              handle_mp_max_bytes(in,out);
                                            }
                                            else {
                                              _Var1 = ptrlen_eq_string(pl,"mp_max_bits");
                                              if (_Var1) {
                                                handle_mp_max_bits(in,out);
                                              }
                                              else {
                                                _Var1 = ptrlen_eq_string(pl,"mp_get_nbits");
                                                if (_Var1) {
                                                  handle_mp_get_nbits(in,out);
                                                }
                                                else {
                                                  _Var1 = ptrlen_eq_string(pl,"mp_get_decimal");
                                                  if (_Var1) {
                                                    handle_mp_get_decimal(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_get_hex");
                                                    if (_Var1) {
                                                      handle_mp_get_hex(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "mp_get_hex_uppercase");
                                                  if (_Var1) {
                                                    handle_mp_get_hex_uppercase(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_cmp_hs");
                                                    if (_Var1) {
                                                      handle_mp_cmp_hs(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_cmp_eq");
                                                      if (_Var1) {
                                                        handle_mp_cmp_eq(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_hs_integer")
                                                        ;
                                                        if (_Var1) {
                                                          handle_mp_hs_integer(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "mp_eq_integer");
                                                  if (_Var1) {
                                                    handle_mp_eq_integer(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_min_into");
                                                    if (_Var1) {
                                                      handle_mp_min_into(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_max_into");
                                                      if (_Var1) {
                                                        handle_mp_max_into(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_min");
                                                        if (_Var1) {
                                                          handle_mp_min(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"mp_max");
                                                          if (_Var1) {
                                                            handle_mp_max(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,
                                                  "mp_copy_into");
                                                  if (_Var1) {
                                                    handle_mp_copy_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_select_into");
                                                    if (_Var1) {
                                                      handle_mp_select_into(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_add_into");
                                                      if (_Var1) {
                                                        handle_mp_add_into(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_sub_into");
                                                        if (_Var1) {
                                                          handle_mp_sub_into(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"mp_mul_into")
                                                          ;
                                                          if (_Var1) {
                                                            handle_mp_mul_into(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,"mp_add");
                                                            if (_Var1) {
                                                              handle_mp_add(in,out);
                                                            }
                                                            else {
                                                              _Var1 = ptrlen_eq_string(pl,"mp_sub");
                                                              if (_Var1) {
                                                                handle_mp_sub(in,out);
                                                              }
                                                              else {
                                                                _Var1 = ptrlen_eq_string(pl,"mp_mul"
                                                                                        );
                                                                if (_Var1) {
                                                                  handle_mp_mul(in,out);
                                                                }
                                                                else {
                                                                  _Var1 = ptrlen_eq_string(pl,
                                                  "mp_and_into");
                                                  if (_Var1) {
                                                    handle_mp_and_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_or_into");
                                                    if (_Var1) {
                                                      handle_mp_or_into(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_xor_into");
                                                      if (_Var1) {
                                                        handle_mp_xor_into(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_bic_into");
                                                        if (_Var1) {
                                                          handle_mp_bic_into(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "mp_copy_integer_into");
                                                  if (_Var1) {
                                                    handle_mp_copy_integer_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "mp_add_integer_into");
                                                  if (_Var1) {
                                                    handle_mp_add_integer_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "mp_sub_integer_into");
                                                  if (_Var1) {
                                                    handle_mp_sub_integer_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "mp_mul_integer_into");
                                                  if (_Var1) {
                                                    handle_mp_mul_integer_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_cond_add_into");
                                                    if (_Var1) {
                                                      handle_mp_cond_add_into(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_cond_sub_into"
                                                                              );
                                                      if (_Var1) {
                                                        handle_mp_cond_sub_into(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_cond_swap");
                                                        if (_Var1) {
                                                          handle_mp_cond_swap(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "mp_cond_clear");
                                                  if (_Var1) {
                                                    handle_mp_cond_clear(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_divmod_into");
                                                    if (_Var1) {
                                                      handle_mp_divmod_into(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_div");
                                                      if (_Var1) {
                                                        handle_mp_div(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_mod");
                                                        if (_Var1) {
                                                          handle_mp_mod(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"mp_nthroot");
                                                          if (_Var1) {
                                                            handle_mp_nthroot(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,
                                                  "mp_reduce_mod_2to");
                                                  if (_Var1) {
                                                    handle_mp_reduce_mod_2to(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_invert_mod_2to")
                                                    ;
                                                    if (_Var1) {
                                                      handle_mp_invert_mod_2to(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_invert");
                                                      if (_Var1) {
                                                        handle_mp_invert(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_gcd_into");
                                                        if (_Var1) {
                                                          handle_mp_gcd_into(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"mp_gcd");
                                                          if (_Var1) {
                                                            handle_mp_gcd(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,"mp_coprime"
                                                                                    );
                                                            if (_Var1) {
                                                              handle_mp_coprime(in,out);
                                                            }
                                                            else {
                                                              _Var1 = ptrlen_eq_string(pl,
                                                  "modsqrt_new");
                                                  if (_Var1) {
                                                    handle_modsqrt_new(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_modsqrt");
                                                    if (_Var1) {
                                                      handle_mp_modsqrt(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"monty_new");
                                                      if (_Var1) {
                                                        handle_monty_new(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"monty_modulus")
                                                        ;
                                                        if (_Var1) {
                                                          handle_monty_modulus(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "monty_identity");
                                                  if (_Var1) {
                                                    handle_monty_identity(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"monty_import_into")
                                                    ;
                                                    if (_Var1) {
                                                      handle_monty_import_into(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"monty_import");
                                                      if (_Var1) {
                                                        handle_monty_import(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "monty_export_into");
                                                  if (_Var1) {
                                                    handle_monty_export_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"monty_export");
                                                    if (_Var1) {
                                                      handle_monty_export(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"monty_mul_into");
                                                      if (_Var1) {
                                                        handle_monty_mul_into(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"monty_add");
                                                        if (_Var1) {
                                                          handle_monty_add(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"monty_sub");
                                                          if (_Var1) {
                                                            handle_monty_sub(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,"monty_mul")
                                                            ;
                                                            if (_Var1) {
                                                              handle_monty_mul(in,out);
                                                            }
                                                            else {
                                                              _Var1 = ptrlen_eq_string(pl,
                                                  "monty_pow");
                                                  if (_Var1) {
                                                    handle_monty_pow(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"monty_invert");
                                                    if (_Var1) {
                                                      handle_monty_invert(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"monty_modsqrt");
                                                      if (_Var1) {
                                                        handle_monty_modsqrt(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"mp_modpow");
                                                        if (_Var1) {
                                                          handle_mp_modpow(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"mp_modmul");
                                                          if (_Var1) {
                                                            handle_mp_modmul(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,"mp_modadd")
                                                            ;
                                                            if (_Var1) {
                                                              handle_mp_modadd(in,out);
                                                            }
                                                            else {
                                                              _Var1 = ptrlen_eq_string(pl,
                                                  "mp_modsub");
                                                  if (_Var1) {
                                                    handle_mp_modsub(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "mp_lshift_safe_into");
                                                  if (_Var1) {
                                                    handle_mp_lshift_safe_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "mp_rshift_safe_into");
                                                  if (_Var1) {
                                                    handle_mp_rshift_safe_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_rshift_safe");
                                                    if (_Var1) {
                                                      handle_mp_rshift_safe(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "mp_lshift_fixed_into");
                                                  if (_Var1) {
                                                    handle_mp_lshift_fixed_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "mp_rshift_fixed_into");
                                                  if (_Var1) {
                                                    handle_mp_rshift_fixed_into(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"mp_rshift_fixed");
                                                    if (_Var1) {
                                                      handle_mp_rshift_fixed(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"mp_random_bits");
                                                      if (_Var1) {
                                                        handle_mp_random_bits(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "mp_random_in_range");
                                                  if (_Var1) {
                                                    handle_mp_random_in_range(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_curve");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_curve(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_point_new_identity");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_point_new_identity
                                                              (in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_point_new");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_point_new(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_point_new_from_x");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_point_new_from_x(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_point_copy");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_point_copy(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_point_valid");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_point_valid(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_add_general");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_add_general(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_add");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_add(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_double");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_double(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_multiply");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_multiply(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_is_identity");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_is_identity(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_weierstrass_get_affine");
                                                  if (_Var1) {
                                                    handle_ecc_weierstrass_get_affine(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_curve");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_curve(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_point_new");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_point_new(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_point_copy");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_point_copy(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_diff_add");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_diff_add(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_double");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_double(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_multiply");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_multiply(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_get_affine");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_get_affine(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_montgomery_is_identity");
                                                  if (_Var1) {
                                                    handle_ecc_montgomery_is_identity(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ecc_edwards_curve")
                                                    ;
                                                    if (_Var1) {
                                                      handle_ecc_edwards_curve(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_edwards_point_new");
                                                  if (_Var1) {
                                                    handle_ecc_edwards_point_new(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_edwards_point_new_from_y");
                                                  if (_Var1) {
                                                    handle_ecc_edwards_point_new_from_y(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_edwards_point_copy");
                                                  if (_Var1) {
                                                    handle_ecc_edwards_point_copy(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ecc_edwards_add");
                                                    if (_Var1) {
                                                      handle_ecc_edwards_add(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_edwards_multiply");
                                                  if (_Var1) {
                                                    handle_ecc_edwards_multiply(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ecc_edwards_eq");
                                                    if (_Var1) {
                                                      handle_ecc_edwards_eq(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ecc_edwards_get_affine");
                                                  if (_Var1) {
                                                    handle_ecc_edwards_get_affine(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_hash_new");
                                                    if (_Var1) {
                                                      handle_ssh_hash_new(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ssh_hash_reset");
                                                      if (_Var1) {
                                                        handle_ssh_hash_reset(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"ssh_hash_copy")
                                                        ;
                                                        if (_Var1) {
                                                          handle_ssh_hash_copy(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_hash_digest");
                                                  if (_Var1) {
                                                    handle_ssh_hash_digest(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_hash_final");
                                                    if (_Var1) {
                                                      handle_ssh_hash_final(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ssh_hash_update")
                                                      ;
                                                      if (_Var1) {
                                                        handle_ssh_hash_update(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "blake2b_new_general");
                                                  if (_Var1) {
                                                    handle_blake2b_new_general(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh2_mac_new");
                                                    if (_Var1) {
                                                      handle_ssh2_mac_new(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ssh2_mac_setkey")
                                                      ;
                                                      if (_Var1) {
                                                        handle_ssh2_mac_setkey(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"ssh2_mac_start"
                                                                                );
                                                        if (_Var1) {
                                                          handle_ssh2_mac_start(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "ssh2_mac_update");
                                                  if (_Var1) {
                                                    handle_ssh2_mac_update(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh2_mac_genresult"
                                                                            );
                                                    if (_Var1) {
                                                      handle_ssh2_mac_genresult(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ssh2_mac_text_name");
                                                  if (_Var1) {
                                                    handle_ssh2_mac_text_name(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_key_new_pub");
                                                    if (_Var1) {
                                                      handle_ssh_key_new_pub(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ssh_key_new_priv"
                                                                              );
                                                      if (_Var1) {
                                                        handle_ssh_key_new_priv(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_new_priv_openssh");
                                                  if (_Var1) {
                                                    handle_ssh_key_new_priv_openssh(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_key_invalid");
                                                    if (_Var1) {
                                                      handle_ssh_key_invalid(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ssh_key_sign");
                                                      if (_Var1) {
                                                        handle_ssh_key_sign(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"ssh_key_verify"
                                                                                );
                                                        if (_Var1) {
                                                          handle_ssh_key_verify(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_public_blob");
                                                  if (_Var1) {
                                                    handle_ssh_key_public_blob(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_private_blob");
                                                  if (_Var1) {
                                                    handle_ssh_key_private_blob(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_openssh_blob");
                                                  if (_Var1) {
                                                    handle_ssh_key_openssh_blob(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_key_cache_str")
                                                    ;
                                                    if (_Var1) {
                                                      handle_ssh_key_cache_str(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_components");
                                                  if (_Var1) {
                                                    handle_ssh_key_components(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_public_bits");
                                                  if (_Var1) {
                                                    handle_ssh_key_public_bits(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_key_base_key");
                                                    if (_Var1) {
                                                      handle_ssh_key_base_key(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_ca_public_blob");
                                                  if (_Var1) {
                                                    handle_ssh_key_ca_public_blob(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_key_cert_id_string");
                                                  if (_Var1) {
                                                    handle_ssh_key_cert_id_string(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_key_check_cert"
                                                                            );
                                                    if (_Var1) {
                                                      handle_ssh_key_check_cert(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "key_components_count");
                                                  if (_Var1) {
                                                    handle_key_components_count(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "key_components_nth_name");
                                                  if (_Var1) {
                                                    handle_key_components_nth_name(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "key_components_nth_str");
                                                  if (_Var1) {
                                                    handle_key_components_nth_str(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "key_components_nth_mp");
                                                  if (_Var1) {
                                                    handle_key_components_nth_mp(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_cipher_new");
                                                    if (_Var1) {
                                                      handle_ssh_cipher_new(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ssh_cipher_setiv"
                                                                              );
                                                      if (_Var1) {
                                                        handle_ssh_cipher_setiv(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_cipher_setkey");
                                                  if (_Var1) {
                                                    handle_ssh_cipher_setkey(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_cipher_encrypt"
                                                                            );
                                                    if (_Var1) {
                                                      handle_ssh_cipher_encrypt(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_cipher_decrypt");
                                                  if (_Var1) {
                                                    handle_ssh_cipher_decrypt(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_cipher_encrypt_length");
                                                  if (_Var1) {
                                                    handle_ssh_cipher_encrypt_length(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_cipher_decrypt_length");
                                                  if (_Var1) {
                                                    handle_ssh_cipher_decrypt_length(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"dh_setup_group");
                                                    if (_Var1) {
                                                      handle_dh_setup_group(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"dh_setup_gex");
                                                      if (_Var1) {
                                                        handle_dh_setup_gex(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "dh_modulus_bit_size");
                                                  if (_Var1) {
                                                    handle_dh_modulus_bit_size(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"dh_create_e");
                                                    if (_Var1) {
                                                      handle_dh_create_e(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"dh_validate_f");
                                                      if (_Var1) {
                                                        handle_dh_validate_f(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"dh_find_K");
                                                        if (_Var1) {
                                                          handle_dh_find_K(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"ecdh_key_new"
                                                                                  );
                                                          if (_Var1) {
                                                            handle_ecdh_key_new(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,
                                                  "ecdh_key_getpublic");
                                                  if (_Var1) {
                                                    handle_ecdh_key_getpublic(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ecdh_key_getkey");
                                                    if (_Var1) {
                                                      handle_ecdh_key_getkey(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ntru_ring_multiply");
                                                  if (_Var1) {
                                                    handle_ntru_ring_multiply(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ntru_ring_invert");
                                                    if (_Var1) {
                                                      handle_ntru_ring_invert(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ntru_mod3");
                                                      if (_Var1) {
                                                        handle_ntru_mod3(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"ntru_round3");
                                                        if (_Var1) {
                                                          handle_ntru_round3(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"ntru_bias");
                                                          if (_Var1) {
                                                            handle_ntru_bias(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,"ntru_scale"
                                                                                    );
                                                            if (_Var1) {
                                                              handle_ntru_scale(in,out);
                                                            }
                                                            else {
                                                              _Var1 = ptrlen_eq_string(pl,
                                                  "ntru_encode_schedule");
                                                  if (_Var1) {
                                                    handle_ntru_encode_schedule(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "ntru_encode_schedule_length");
                                                  if (_Var1) {
                                                    handle_ntru_encode_schedule_length(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ntru_encode");
                                                    if (_Var1) {
                                                      handle_ntru_encode(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ntru_decode");
                                                      if (_Var1) {
                                                        handle_ntru_decode(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"ntru_gen_short"
                                                                                );
                                                        if (_Var1) {
                                                          handle_ntru_gen_short(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"ntru_keygen")
                                                          ;
                                                          if (_Var1) {
                                                            handle_ntru_keygen(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,
                                                  "ntru_pubkey");
                                                  if (_Var1) {
                                                    handle_ntru_pubkey(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ntru_encrypt");
                                                    if (_Var1) {
                                                      handle_ntru_encrypt(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ntru_decrypt");
                                                      if (_Var1) {
                                                        handle_ntru_decrypt(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_rsakex_newkey");
                                                  if (_Var1) {
                                                    handle_ssh_rsakex_newkey(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_rsakex_klen");
                                                    if (_Var1) {
                                                      handle_ssh_rsakex_klen(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "ssh_rsakex_encrypt");
                                                  if (_Var1) {
                                                    handle_ssh_rsakex_encrypt(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ssh_rsakex_decrypt"
                                                                            );
                                                    if (_Var1) {
                                                      handle_ssh_rsakex_decrypt(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "get_rsa_ssh1_priv_agent");
                                                  if (_Var1) {
                                                    handle_get_rsa_ssh1_priv_agent(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"rsa_new");
                                                    if (_Var1) {
                                                      handle_rsa_new(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"get_rsa_ssh1_pub"
                                                                              );
                                                      if (_Var1) {
                                                        handle_get_rsa_ssh1_pub(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "get_rsa_ssh1_priv");
                                                  if (_Var1) {
                                                    handle_get_rsa_ssh1_priv(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"rsa_ssh1_encrypt");
                                                    if (_Var1) {
                                                      handle_rsa_ssh1_encrypt(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"rsa_ssh1_decrypt"
                                                                              );
                                                      if (_Var1) {
                                                        handle_rsa_ssh1_decrypt(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "rsa_ssh1_decrypt_pkcs1");
                                                  if (_Var1) {
                                                    handle_rsa_ssh1_decrypt_pkcs1(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"rsastr_fmt");
                                                    if (_Var1) {
                                                      handle_rsastr_fmt(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "rsa_ssh1_fingerprint");
                                                  if (_Var1) {
                                                    handle_rsa_ssh1_fingerprint(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "rsa_ssh1_public_blob");
                                                  if (_Var1) {
                                                    handle_rsa_ssh1_public_blob(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "rsa_ssh1_public_blob_len");
                                                  if (_Var1) {
                                                    handle_rsa_ssh1_public_blob_len(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "rsa_ssh1_private_blob_agent");
                                                  if (_Var1) {
                                                    handle_rsa_ssh1_private_blob_agent(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"prng_new");
                                                    if (_Var1) {
                                                      handle_prng_new(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"prng_seed_begin")
                                                      ;
                                                      if (_Var1) {
                                                        handle_prng_seed_begin(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "prng_seed_update");
                                                  if (_Var1) {
                                                    handle_prng_seed_update(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"prng_seed_finish");
                                                    if (_Var1) {
                                                      handle_prng_seed_finish(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"prng_read");
                                                      if (_Var1) {
                                                        handle_prng_read(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "prng_add_entropy");
                                                  if (_Var1) {
                                                    handle_prng_add_entropy(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ppk_encrypted_s");
                                                    if (_Var1) {
                                                      handle_ppk_encrypted_s(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"rsa1_encrypted_s"
                                                                              );
                                                      if (_Var1) {
                                                        handle_rsa1_encrypted_s(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"ppk_loadpub_s")
                                                        ;
                                                        if (_Var1) {
                                                          handle_ppk_loadpub_s(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "rsa1_loadpub_s");
                                                  if (_Var1) {
                                                    handle_rsa1_loadpub_s(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ppk_load_s");
                                                    if (_Var1) {
                                                      handle_ppk_load_s(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"rsa1_load_s");
                                                      if (_Var1) {
                                                        handle_rsa1_load_s(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"ppk_save_sb");
                                                        if (_Var1) {
                                                          handle_ppk_save_sb(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"rsa1_save_sb"
                                                                                  );
                                                          if (_Var1) {
                                                            handle_rsa1_save_sb(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,
                                                  "ssh2_fingerprint_blob");
                                                  if (_Var1) {
                                                    handle_ssh2_fingerprint_blob(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"argon2");
                                                    if (_Var1) {
                                                      handle_argon2(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"argon2_long_hash"
                                                                              );
                                                      if (_Var1) {
                                                        handle_argon2_long_hash(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"openssh_bcrypt"
                                                                                );
                                                        if (_Var1) {
                                                          handle_openssh_bcrypt(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"rsa_generate"
                                                                                  );
                                                          if (_Var1) {
                                                            handle_rsa_generate(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,
                                                  "dsa_generate");
                                                  if (_Var1) {
                                                    handle_dsa_generate(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"ecdsa_generate");
                                                    if (_Var1) {
                                                      handle_ecdsa_generate(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"eddsa_generate");
                                                      if (_Var1) {
                                                        handle_eddsa_generate(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"rsa1_generate")
                                                        ;
                                                        if (_Var1) {
                                                          handle_rsa1_generate(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "primegen_new_context");
                                                  if (_Var1) {
                                                    handle_primegen_new_context(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"primegen_generate")
                                                    ;
                                                    if (_Var1) {
                                                      handle_primegen_generate(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "primegen_mpu_certificate");
                                                  if (_Var1) {
                                                    handle_primegen_mpu_certificate(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"pcs_new");
                                                    if (_Var1) {
                                                      handle_pcs_new(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "pcs_new_with_firstbits");
                                                  if (_Var1) {
                                                    handle_pcs_new_with_firstbits(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "pcs_require_residue");
                                                  if (_Var1) {
                                                    handle_pcs_require_residue(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "pcs_require_residue_1");
                                                  if (_Var1) {
                                                    handle_pcs_require_residue_1(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "pcs_require_residue_1_mod_prime");
                                                  if (_Var1) {
                                                    handle_pcs_require_residue_1_mod_prime(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "pcs_avoid_residue_small");
                                                  if (_Var1) {
                                                    handle_pcs_avoid_residue_small(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "pcs_try_sophie_germain");
                                                  if (_Var1) {
                                                    handle_pcs_try_sophie_germain(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"pcs_set_oneshot");
                                                    if (_Var1) {
                                                      handle_pcs_set_oneshot(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"pcs_ready");
                                                      if (_Var1) {
                                                        handle_pcs_ready(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"pcs_inspect");
                                                        if (_Var1) {
                                                          handle_pcs_inspect(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"pcs_generate"
                                                                                  );
                                                          if (_Var1) {
                                                            handle_pcs_generate(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,"pockle_new"
                                                                                    );
                                                            if (_Var1) {
                                                              handle_pockle_new(in,out);
                                                            }
                                                            else {
                                                              _Var1 = ptrlen_eq_string(pl,
                                                  "pockle_mark");
                                                  if (_Var1) {
                                                    handle_pockle_mark(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"pockle_release");
                                                    if (_Var1) {
                                                      handle_pockle_release(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,
                                                  "pockle_add_small_prime");
                                                  if (_Var1) {
                                                    handle_pockle_add_small_prime(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"pockle_add_prime");
                                                    if (_Var1) {
                                                      handle_pockle_add_prime(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"pockle_mpu");
                                                      if (_Var1) {
                                                        handle_pockle_mpu(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "miller_rabin_new");
                                                  if (_Var1) {
                                                    handle_miller_rabin_new(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"miller_rabin_test")
                                                    ;
                                                    if (_Var1) {
                                                      handle_miller_rabin_test(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"ecdsa_public");
                                                      if (_Var1) {
                                                        handle_ecdsa_public(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"eddsa_public");
                                                        if (_Var1) {
                                                          handle_eddsa_public(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,
                                                  "des_encrypt_xdmauth");
                                                  if (_Var1) {
                                                    handle_des_encrypt_xdmauth(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "des_decrypt_xdmauth");
                                                  if (_Var1) {
                                                    handle_des_decrypt_xdmauth(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "des3_encrypt_pubkey");
                                                  if (_Var1) {
                                                    handle_des3_encrypt_pubkey(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "des3_decrypt_pubkey");
                                                  if (_Var1) {
                                                    handle_des3_decrypt_pubkey(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "des3_encrypt_pubkey_ossh");
                                                  if (_Var1) {
                                                    handle_des3_encrypt_pubkey_ossh(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "des3_decrypt_pubkey_ossh");
                                                  if (_Var1) {
                                                    handle_des3_decrypt_pubkey_ossh(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "aes256_encrypt_pubkey");
                                                  if (_Var1) {
                                                    handle_aes256_encrypt_pubkey(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "aes256_decrypt_pubkey");
                                                  if (_Var1) {
                                                    handle_aes256_decrypt_pubkey(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"crc32_rfc1662");
                                                    if (_Var1) {
                                                      handle_crc32_rfc1662(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"crc32_ssh1");
                                                      if (_Var1) {
                                                        handle_crc32_ssh1(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,"crc32_update");
                                                        if (_Var1) {
                                                          handle_crc32_update(in,out);
                                                        }
                                                        else {
                                                          _Var1 = ptrlen_eq_string(pl,"crcda_detect"
                                                                                  );
                                                          if (_Var1) {
                                                            handle_crcda_detect(in,out);
                                                          }
                                                          else {
                                                            _Var1 = ptrlen_eq_string(pl,
                                                  "get_implementations_commasep");
                                                  if (_Var1) {
                                                    handle_get_implementations_commasep(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,
                                                  "http_digest_response");
                                                  if (_Var1) {
                                                    handle_http_digest_response(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"random_queue");
                                                    if (_Var1) {
                                                      handle_random_queue(in,out);
                                                    }
                                                    else {
                                                      _Var1 = ptrlen_eq_string(pl,"random_queue_len"
                                                                              );
                                                      if (_Var1) {
                                                        handle_random_queue_len(in,out);
                                                      }
                                                      else {
                                                        _Var1 = ptrlen_eq_string(pl,
                                                  "random_make_prng");
                                                  if (_Var1) {
                                                    handle_random_make_prng(in,out);
                                                  }
                                                  else {
                                                    _Var1 = ptrlen_eq_string(pl,"random_clear");
                                                    if (!_Var1) {
                                                      id.ptr = (void *)pl.len;
                                                      uVar2 = string_length_for_printf
                                                                        ((size_t)id.ptr);
                                                      local_28 = pl.ptr;
                                                      fatal_error("command \'%.*s\': unrecognised",
                                                                  (ulong)uVar2,local_28);
                                                    }
                                                    handle_random_clear(in,out);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void process_line(BinarySource *in, strbuf *out)
{
    ptrlen id = get_word(in);

#define DISPATCH_INTERNAL(cmdname, handler) do {        \
        if (ptrlen_eq_string(id, cmdname)) {            \
            handler(in, out);                           \
            return;                                     \
        }                                               \
    } while (0)

#define DISPATCH_COMMAND(cmd) DISPATCH_INTERNAL(#cmd, handle_##cmd)
    DISPATCH_COMMAND(hello);
    DISPATCH_COMMAND(free);
    DISPATCH_COMMAND(newstring);
    DISPATCH_COMMAND(getstring);
    DISPATCH_COMMAND(mp_literal);
    DISPATCH_COMMAND(mp_dump);
    DISPATCH_COMMAND(checkenum);
#undef DISPATCH_COMMAND

#define FUNC_INNER(outtype, fname, realname, ...)       \
    DISPATCH_INTERNAL(#fname,handle_##fname);
#define ARG1(type, arg)
#define ARGN(type, arg)
#define VOID
#include "testcrypt-func.h"
#undef FUNC_INNER
#undef ARG
#undef VOID

#undef DISPATCH_INTERNAL

    fatal_error("command '%.*s': unrecognised", PTRLEN_PRINTF(id));
}